

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScheduledReporter.cc
# Opt level: O2

void __thiscall cppmetrics::ScheduledReporter::~ScheduledReporter(ScheduledReporter *this)

{
  ~ScheduledReporter(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

ScheduledReporter::~ScheduledReporter()
{
  std::unique_lock<std::mutex> lock(m_mutex);
  m_is_running = false;
  m_cv.notify_all();
  lock.unlock();

  if (m_reporter_thread.joinable())
  {
    m_reporter_thread.join();
  }
}